

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void wallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat,
             _func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  fixed_t *pfVar1;
  float *pfVar2;
  float fVar3;
  short sVar4;
  short sVar5;
  fixed_t fVar6;
  int iVar7;
  DWORD DVar8;
  int iVar9;
  BYTE *pBVar10;
  ulong uVar11;
  int iVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  float local_e0;
  long local_d8;
  float *local_d0;
  int local_b8 [4];
  int local_a8 [4];
  BYTE *local_98;
  short *local_90;
  short *local_88;
  double local_80;
  _func_BYTE_ptr_FTexture_ptr_int *local_78;
  double local_70;
  fixed_t *local_68;
  int local_5c;
  long local_58;
  ulong local_50;
  fixed_t *local_48;
  float *local_40;
  long local_38;
  
  if (rw_pic->UseType == '\r') {
    return;
  }
  local_e0 = rw_light - rw_lightstep;
  local_78 = getcol;
  iVar12 = 0x20 - (uint)rw_pic->HeightBits;
  local_70 = yrepeat;
  setupvline(iVar12);
  fVar6 = rw_offset;
  bVar17 = fixedcolormap != (lighttable_t *)0x0;
  bVar18 = -1 < fixedlightlev;
  local_98 = basecolormap->Maps;
  if (bVar18 || bVar17) {
    palookupoffse[1]._0_4_ = (int)dc_colormap;
    palookupoffse[0] = dc_colormap;
    palookupoffse[1]._4_4_ = (int)((ulong)dc_colormap >> 0x20);
    palookupoffse._16_16_ = palookupoffse._0_16_;
  }
  local_80 = 6755399441055744.0 / (double)(1 << ((byte)iVar12 & 0x1f));
  uVar11 = (ulong)x1;
  local_58 = (long)x2;
  local_88 = uwal + uVar11;
  local_90 = dwal + uVar11;
  local_48 = lwal;
  pfVar1 = lwal + uVar11;
  local_40 = swal;
  pfVar2 = swal + uVar11;
  local_d8 = 0;
  local_68 = pfVar1;
  local_50 = uVar11;
  iVar12 = x2;
  local_d0 = pfVar2;
  do {
    if ((local_58 <= (long)uVar11) || ((uVar11 & 3) == 0)) {
      local_a8[0] = (int)lwal;
      local_b8[0] = iVar12;
      local_38 = (long)(x2 + -3);
      lVar14 = (long)local_90 + local_d8;
      lVar15 = (long)local_88 + local_d8;
      do {
        pfVar2 = local_40;
        pfVar1 = local_48;
        if (local_38 <= (long)uVar11) {
          lVar14 = local_50 * 4;
          lVar15 = local_50 * 4;
          do {
            if (local_58 <= (long)uVar11) {
              NetUpdate();
              return;
            }
            local_e0 = local_e0 + rw_lightstep;
            sVar4 = *(short *)((long)local_88 + local_d8);
            sVar5 = *(short *)((long)local_90 + local_d8);
            if (sVar4 < sVar5) {
              iVar12 = (int)sVar4;
              if (viewheight <= iVar12) {
                __assert_fail("y1ve[0] < viewheight",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                              ,0x4c7,
                              "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                             );
              }
              if (viewheight < sVar5) {
                __assert_fail("y2ve[0] <= viewheight",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                              ,0x4c8,
                              "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                             );
              }
              if (!bVar18 && !bVar17) {
                dVar19 = (double)local_e0;
                if (24.0 <= dVar19) {
                  dVar19 = 24.0;
                }
                iVar9 = wallshade - SUB84(dVar19 + 103079215104.0,0) >> 0x10;
                if (0x1e < iVar9) {
                  iVar9 = 0x1f;
                }
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                dc_colormap = local_98 + (uint)(iVar9 << 8);
              }
              dc_source = (*local_78)(rw_pic,*(int *)((long)pfVar1 + local_d8 * 2 + lVar14) + fVar6
                                             >> 0x10);
              dc_dest = dc_destorg + uVar11 + (long)ylookup[sVar4];
              dc_count = sVar5 - iVar12;
              dVar19 = (double)*(float *)((long)pfVar2 + local_d8 * 2 + lVar15) * local_70;
              dc_iscale = SUB84(dVar19 + local_80,0);
              dc_texturefrac =
                   SUB84(dc_texturemid + local_80 + (((double)iVar12 + 0.5) - CenterY) * dVar19,0);
              (*dovline1)();
            }
            uVar11 = uVar11 + 1;
            local_d8 = local_d8 + 2;
          } while( true );
        }
        bVar13 = 0;
        for (lVar16 = 3; fVar3 = rw_lightstep, iVar12 = wallshade, -1 < lVar16; lVar16 = lVar16 + -1
            ) {
          sVar4 = *(short *)(lVar15 + lVar16 * 2);
          iVar12 = (int)sVar4;
          local_a8[lVar16] = iVar12;
          sVar5 = *(short *)(lVar14 + lVar16 * 2);
          local_b8[lVar16] = (int)sVar5;
          if (sVar4 < sVar5) {
            if (viewheight <= iVar12) {
              __assert_fail("y1ve[z] < viewheight",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                            ,0x482,
                            "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                           );
            }
            if (viewheight < sVar5) {
              __assert_fail("y2ve[z] <= viewheight",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                            ,0x483,
                            "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                           );
            }
            pBVar10 = (*local_78)(rw_pic,local_68[lVar16] + fVar6 >> 0x10);
            bufplce[lVar16] = pBVar10;
            fVar3 = local_d0[lVar16];
            dVar19 = ((double)iVar12 + 0.5) - CenterY;
            vince[lVar16] = SUB84((double)fVar3 * local_70 + local_80,0);
            vplce[lVar16] = SUB84(dc_texturemid + local_80 + dVar19 * (double)fVar3 * local_70,0);
          }
          else {
            bVar13 = bVar13 + (char)(1 << ((byte)lVar16 & 0x1f));
          }
        }
        if (bVar13 == 0xf) {
          local_e0 = local_e0 + rw_lightstep * 4.0;
        }
        else {
          if (!bVar18 && !bVar17) {
            for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
              local_e0 = local_e0 + fVar3;
              dVar19 = (double)local_e0;
              if (24.0 <= dVar19) {
                dVar19 = 24.0;
              }
              iVar9 = iVar12 - SUB84(dVar19 + 103079215104.0,0) >> 0x10;
              if (0x1e < iVar9) {
                iVar9 = 0x1f;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              palookupoffse[lVar16] = local_98 + (uint)(iVar9 << 8);
            }
          }
          iVar12 = local_a8[1];
          if (local_a8[1] < local_a8[0]) {
            iVar12 = local_a8[0];
          }
          iVar9 = local_a8[3];
          if (local_a8[3] < local_a8[2]) {
            iVar9 = local_a8[2];
          }
          if (iVar9 < iVar12) {
            iVar9 = iVar12;
          }
          iVar12 = local_b8[1];
          if (local_b8[0] < local_b8[1]) {
            iVar12 = local_b8[0];
          }
          iVar7 = local_b8[3];
          if (local_b8[2] < local_b8[3]) {
            iVar7 = local_b8[2];
          }
          if (iVar12 < iVar7) {
            iVar7 = iVar12;
          }
          if ((bVar13 == 0) && (iVar7 - iVar9 != 0 && iVar9 <= iVar7)) {
            local_5c = iVar7 - iVar9;
            for (lVar16 = -4; lVar16 != 0; lVar16 = lVar16 + 1) {
              iVar12 = *(int *)((long)&local_98 + lVar16 * 4);
              if (iVar12 < iVar9) {
                dc_count = iVar9 - iVar12;
                dc_iscale = *(fixed_t *)((long)palookupoffse + lVar16 * 4);
                dc_colormap = bufplce[lVar16];
                dc_texturefrac = vince[lVar16];
                dc_source = *(BYTE **)(&dccount + lVar16 * 2);
                dc_dest = dc_destorg + (ylookup[iVar12] + 4 + x1 + (int)lVar16);
                DVar8 = (*doprevline1)();
                vince[lVar16] = DVar8;
              }
            }
            dc_count = local_5c;
            dc_dest = dc_destorg + (long)ylookup[iVar9] + uVar11;
            vlinetallasm4();
            pBVar10 = dc_destorg;
            iVar12 = ylookup[iVar7];
            for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
              iVar9 = local_b8[lVar16] - iVar7;
              if (iVar9 != 0 && iVar7 <= local_b8[lVar16]) {
                dc_iscale = vince[lVar16];
                dc_colormap = palookupoffse[0];
                dc_texturefrac = vplce[lVar16];
                dc_source = bufplce[lVar16];
                dc_dest = pBVar10 + lVar16 + (long)iVar12 + uVar11;
                dc_count = iVar9;
                (*doprevline1)();
              }
            }
          }
          else {
            for (lVar16 = -4; lVar16 != 0; lVar16 = lVar16 + 1) {
              if ((bVar13 & 1) == 0) {
                iVar12 = *(int *)((long)&local_98 + lVar16 * 4);
                dc_count = local_a8[lVar16] - iVar12;
                dc_iscale = *(fixed_t *)((long)palookupoffse + lVar16 * 4);
                dc_colormap = bufplce[lVar16];
                dc_texturefrac = vince[lVar16];
                dc_source = *(BYTE **)(&dccount + lVar16 * 2);
                dc_dest = dc_destorg + (ylookup[iVar12] + 4 + x1 + (int)lVar16);
                (*doprevline1)();
              }
              bVar13 = (char)bVar13 >> 1;
            }
          }
        }
        uVar11 = uVar11 + 4;
        local_d8 = local_d8 + 8;
        lVar15 = lVar15 + 8;
        lVar14 = lVar14 + 8;
        local_68 = local_68 + 4;
        local_d0 = local_d0 + 4;
        x1 = x1 + 4;
      } while( true );
    }
    local_e0 = local_e0 + rw_lightstep;
    sVar4 = *(short *)((long)local_88 + local_d8);
    lwal = (fixed_t *)(long)sVar4;
    iVar12 = (int)*(short *)((long)local_90 + local_d8);
    if (sVar4 < *(short *)((long)local_90 + local_d8)) {
      iVar9 = (int)sVar4;
      if (viewheight <= iVar9) {
        __assert_fail("y1ve[0] < viewheight",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                      ,0x468,
                      "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                     );
      }
      if (viewheight < iVar12) {
        __assert_fail("y2ve[0] <= viewheight",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                      ,0x469,
                      "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                     );
      }
      if (!bVar18 && !bVar17) {
        dVar19 = (double)local_e0;
        if (24.0 <= dVar19) {
          dVar19 = 24.0;
        }
        iVar7 = wallshade - SUB84(dVar19 + 103079215104.0,0) >> 0x10;
        if (0x1e < iVar7) {
          iVar7 = 0x1f;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        dc_colormap = local_98 + (uint)(iVar7 << 8);
      }
      dc_source = (*local_78)(rw_pic,*(int *)((long)pfVar1 + local_d8 * 2) + fVar6 >> 0x10);
      dc_dest = dc_destorg + uVar11 + (long)ylookup[(long)lwal];
      dc_count = iVar12 - iVar9;
      dVar19 = (double)*(float *)((long)pfVar2 + local_d8 * 2) * local_70;
      dc_iscale = SUB84(dVar19 + local_80,0);
      dc_texturefrac =
           SUB84(dc_texturemid + local_80 + (((double)iVar9 + 0.5) - CenterY) * dVar19,0);
      (*dovline1)();
    }
    uVar11 = uVar11 + 1;
    local_d8 = local_d8 + 2;
    local_68 = local_68 + 1;
    local_d0 = local_d0 + 1;
    x1 = x1 + 1;
  } while( true );
}

Assistant:

void wallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
			   double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	int x, fracbits;
	int y1ve[4], y2ve[4], u4, d4, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	// This function also gets used to draw skies. Unlike BUILD, skies are
	// drawn by visplane instead of by bunch, so these checks are invalid.
	//if ((uwal[x1] > viewheight) && (uwal[x2] > viewheight)) return;
	//if ((dwal[x1] < 0) && (dwal[x2] < 0)) return;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setupvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;

	x = x1;
	//while ((umost[x] > dmost[x]) && (x < x2)) x++;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && (x & 3); ++x)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

	for(; x < x2-3; x += 4)
	{
		bad = 0;
		for (z = 3; z>= 0; --z)
		{
			y1ve[z] = uwal[x+z];//max(uwal[x+z],umost[x+z]);
			y2ve[z] = dwal[x+z];//min(dwal[x+z],dmost[x+z])-1;
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }
			assert (y1ve[z] < viewheight);
			assert (y2ve[z] <= viewheight);

			bufplce[z] = getcol (rw_pic, (lwal[x+z] + xoffset) >> FRACBITS);
			iscale = swal[x + z] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					prevline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				vplce[z] = prevline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+x+dc_destorg;
			dovline4();
		}

		BYTE *i = x+ylookup[d4]+dc_destorg;
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				prevline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
			}
		}
	}
	for(;x<x2;x++)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

//unclock (WallScanCycles);

	NetUpdate ();
}